

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O1

rx_status rx__str_initialize(size_t *count,char *s,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  char *fmt_00;
  char *file;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (count != (size_t *)0x0) {
    local_d8 = local_c8;
    local_e0 = &args[0].overflow_arg_area;
    local_e8 = 0x3000000018;
    if (s == (char *)0x0) {
      file = (char *)0x0;
      iVar1 = vsnprintf((char *)0x0,0,fmt,&local_e8);
      if (-1 < iVar1) {
        *count = (ulong)(iVar1 + 1);
        return RX_SUCCESS;
      }
      fmt_00 = "invalid string formatting\n";
      iVar1 = 0x13f9;
    }
    else {
      iVar1 = vsprintf(s,fmt,&local_e8);
      if (-1 < iVar1) {
        *count = (ulong)(iVar1 + 1);
        return RX_SUCCESS;
      }
      fmt_00 = "unexpected string formatting error\n";
      iVar1 = 0x140a;
      file = fmt;
    }
    rx__log(RX_LOG_LEVEL_ALL,file,iVar1,fmt_00);
    return RX_ERROR;
  }
  __assert_fail("count != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x1419,"enum rx_status rx__str_initialize(size_t *, char *, const char *, ...)");
}

Assistant:

static enum rx_status
rx__str_initialize(size_t *count, char *s, const char *fmt, ...)
{
    enum rx_status out;
    va_list args;

    RX_ASSERT(count != NULL);

    va_start(args, fmt);
    out = rx__str_initialize_va_list(count, s, fmt, args);
    va_end(args);

    return out;
}